

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# three_dim_model.cpp
# Opt level: O2

input_type __thiscall MODEL3D::three_dim_model::hash_prop(three_dim_model *this,string *inString)

{
  bool bVar1;
  input_type iVar2;
  
  bVar1 = std::operator==(inString,"Number");
  if (bVar1) {
    iVar2 = eNumber;
  }
  else {
    bVar1 = std::operator==(inString,"Name");
    if (bVar1) {
      iVar2 = eName;
    }
    else {
      bVar1 = std::operator==(inString,"MaskType");
      if (bVar1) {
        iVar2 = eMask_type;
      }
      else {
        bVar1 = std::operator==(inString,"ZStart");
        if (bVar1) {
          iVar2 = eZ_Start;
        }
        else {
          bVar1 = std::operator==(inString,"Thickness");
          if (bVar1) {
            iVar2 = eThickness;
          }
          else {
            bVar1 = std::operator==(inString,"Material");
            if (bVar1) {
              iVar2 = eMaterial;
            }
            else {
              bVar1 = std::operator==(inString,"$End");
              iVar2 = eDefault;
              if (bVar1) {
                iVar2 = eError;
              }
            }
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

MODEL3D::input_type MODEL3D::three_dim_model::hash_prop(std::string const& inString)
{
    if(inString == "Number") return eNumber;
    if(inString == "Name") return eName;
    if(inString == "MaskType") return eMask_type;
    if(inString == "ZStart") return eZ_Start;
    if(inString == "Thickness") return eThickness;
    if(inString == "Material") return eMaterial;
    if(inString == "$End") return eError;
    return eDefault;
}